

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImGui::FindWindowFocusIndex(ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  ImGuiWindow **ppIVar2;
  ImGuiWindow *in_RDI;
  int i;
  ImGuiContext *g;
  int local_1c;
  
  pIVar1 = GImGui;
  local_1c = (GImGui->WindowsFocusOrder).Size;
  do {
    local_1c = local_1c + -1;
    if (local_1c < 0) {
      return -1;
    }
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->WindowsFocusOrder,local_1c);
  } while (*ppIVar2 != in_RDI);
  return local_1c;
}

Assistant:

static int ImGui::FindWindowFocusIndex(ImGuiWindow* window) // FIXME-OPT O(N)
{
    ImGuiContext& g = *GImGui;
    for (int i = g.WindowsFocusOrder.Size-1; i >= 0; i--)
        if (g.WindowsFocusOrder[i] == window)
            return i;
    return -1;
}